

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu-exec.c
# Opt level: O2

int cpu_exec_ppc64(uc_struct_conflict11 *uc,CPUState *cpu)

{
  TranslationBlock **ppTVar1;
  uint32_t flags;
  uc_struct_conflict7 *puVar2;
  void *pvVar3;
  CPUClass *pCVar4;
  ulong pc;
  TranslationBlock *pTVar5;
  long lVar6;
  CPUWatchpoint *pCVar7;
  _Bool _Var8;
  char cVar9;
  int iVar10;
  uint uVar11;
  tcg_target_ulong tVar12;
  TranslationBlock *pTVar13;
  long lVar14;
  list_item *plVar15;
  anon_union_16_2_aaf24f3d_for_entry *paVar16;
  TranslationBlock *pTVar17;
  uint uVar18;
  uint32_t cflags;
  CPUClass *pCVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  TranslationBlock *pTStack_80;
  target_ulong local_50;
  undefined4 local_48;
  target_ulong local_40;
  undefined4 local_38;
  
  pCVar19 = cpu->cc;
  if (cpu->halted != 0) {
    if (pCVar19->has_work == (_func__Bool_CPUState_ptr_conflict *)0x0) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/hw/core/cpu.h"
                 ,0x1bc,"cc->has_work");
    }
    _Var8 = (*pCVar19->has_work)((CPUState_conflict *)cpu);
    if (!_Var8) {
      return 0x10003;
    }
    cpu->halted = 0;
  }
  (*pCVar19->cpu_exec_enter)((CPUState_conflict *)cpu);
  iVar10 = __sigsetjmp(uc->exits + (long)uc->nested_level * 0x19 + 0x33,0);
  if (iVar10 != 0) {
    pCVar19 = cpu->cc;
  }
LAB_009d0c67:
  puVar2 = cpu->uc;
  uVar11 = cpu->exception_index;
  if (puVar2->stop_interrupt != (uc_args_int_t_conflict7)0x0) {
    _Var8 = (*puVar2->stop_interrupt)(puVar2,uVar11);
    if (_Var8) {
      plVar15 = (list_item *)(puVar2->hook + 0xe);
      goto LAB_009d10fa;
    }
    uVar11 = cpu->exception_index;
  }
  if (-1 < (int)uVar11) {
    if (0xffff < uVar11) {
      if (uVar11 == 0x10002) {
        pCVar4 = cpu->cc;
        if (cpu->watchpoint_hit == (CPUWatchpoint *)0x0) {
          paVar16 = (anon_union_16_2_aaf24f3d_for_entry *)&cpu->watchpoints;
          while (pCVar7 = paVar16->tqe_next, pCVar7 != (CPUWatchpoint *)0x0) {
            *(byte *)&pCVar7->flags = (byte)pCVar7->flags & 0x3f;
            paVar16 = &pCVar7->entry;
          }
        }
        (*pCVar4->debug_excp_handler)((CPUState_conflict *)cpu);
      }
      cpu->exception_index = -1;
      goto LAB_009d1180;
    }
    ppTVar1 = puVar2->cpu[1].tb_jmp_cache + 0x3ae;
    *ppTVar1 = (TranslationBlock *)((long)&(*ppTVar1)->pc + 4);
    plVar15 = (list_item *)puVar2->hook;
    bVar20 = false;
    while ((plVar15 = plVar15->next, plVar15 != (list_item *)0x0 &&
           (pvVar3 = plVar15->data, pvVar3 != (void *)0x0))) {
      if (*(char *)((long)pvVar3 + 0x14) == '\0') {
        (**(code **)((long)pvVar3 + 0x28))
                  (puVar2,cpu->exception_index,*(undefined8 *)((long)pvVar3 + 0x30));
        bVar20 = true;
      }
    }
    if (!bVar20) goto LAB_009d1154;
    cpu->exception_index = -1;
  }
  pTStack_80 = (TranslationBlock *)0x0;
  pTVar17 = pTStack_80;
  while( true ) {
    pCVar4 = cpu->cc;
    *(undefined2 *)((long)cpu[1].tb_jmp_cache + 0x1aba) = 0;
    uVar11 = cpu->interrupt_request;
    if (uVar11 != 0) {
      uVar18 = uVar11;
      if ((cpu->singlestep_enabled & 2) != 0) {
        uVar18 = uVar11 & 0xffffeda5;
      }
      if ((char)uVar18 < '\0') {
        cpu->interrupt_request = uVar11 & 0xffffff7f;
        cpu->exception_index = 0x10002;
        goto LAB_009d0c67;
      }
      if ((uVar18 >> 10 & 1) != 0) {
        cpu_reset(cpu);
        goto LAB_009d0c67;
      }
      _Var8 = (*pCVar4->cpu_exec_interrupt)((CPUState_conflict *)cpu,uVar18);
      if (_Var8) {
        cpu->exception_index = -1;
        pTVar17 = (TranslationBlock *)0x0;
      }
      if ((cpu->interrupt_request & 4) != 0) {
        cpu->interrupt_request = cpu->interrupt_request & 0xfffffffb;
        pTVar17 = (TranslationBlock *)0x0;
      }
    }
    if (cpu->exit_request == true) break;
    cflags = cpu->cflags_next_tb;
    if (cflags == 0xffffffff) {
      cflags = 0;
    }
    else {
      cpu->cflags_next_tb = 0xffffffff;
    }
    puVar2 = cpu->uc;
    pc = *(ulong *)((long)cpu->env_ptr + 0x2a8);
    flags = *(uint32_t *)((long)cpu->env_ptr + 0x13318);
    uVar11 = (uint)(pc >> 6) ^ (uint)pc;
    uVar11 = uVar11 & 0x3f | uVar11 >> 6 & 0xfc0;
    pTVar13 = cpu->tb_jmp_cache[uVar11];
    uVar18 = cpu->cluster_index << 0x18 | cflags & 0xffffff;
    if (((((pTVar13 == (TranslationBlock *)0x0) || (pTVar13->pc != pc)) || (pTVar13->cs_base != 0))
        || ((pTVar13->flags != flags || (cpu->trace_dstate[0] != (ulong)pTVar13->trace_vcpu_dstate))
           )) || ((pTVar13->cflags & 0xff0effff) != uVar18)) {
      pTVar13 = tb_htable_lookup_ppc64(cpu,pc,0,flags,uVar18);
      if (pTVar13 == (TranslationBlock *)0x0) {
        pTVar13 = tb_gen_code_ppc64(cpu,pc,0,flags,cflags);
        cpu->tb_jmp_cache[uVar11] = pTVar13;
        pTVar5 = puVar2->last_tb;
        if (pTVar5 != (TranslationBlock *)0x0) {
          local_40 = pTVar13->pc;
          uVar11._0_2_ = pTVar13->size;
          uVar11._2_2_ = pTVar13->icount;
          auVar21 = pshuflw(ZEXT416(uVar11),ZEXT416(uVar11),0xe1);
          local_38 = auVar21._0_4_;
          local_50 = pTVar5->pc;
          uVar18._0_2_ = pTVar5->size;
          uVar18._2_2_ = pTVar5->icount;
          auVar21 = pshuflw(ZEXT416(uVar18),ZEXT416(uVar18),0xe1);
          local_48 = auVar21._0_4_;
          plVar15 = (list_item *)(puVar2->hook + 0xf);
          while ((plVar15 = plVar15->next, plVar15 != (list_item *)0x0 &&
                 (pvVar3 = plVar15->data, pvVar3 != (void *)0x0))) {
            if (*(char *)((long)pvVar3 + 0x14) == '\0') {
              if ((*(ulong *)((long)pvVar3 + 0x18) <= pTVar13->pc &&
                   pTVar13->pc <= *(ulong *)((long)pvVar3 + 0x20)) ||
                 (*(ulong *)((long)pvVar3 + 0x20) < *(ulong *)((long)pvVar3 + 0x18))) {
                (**(code **)((long)pvVar3 + 0x28))
                          (puVar2,&local_40,&local_50,*(undefined8 *)((long)pvVar3 + 0x30));
              }
            }
          }
        }
      }
      else {
        cpu->tb_jmp_cache[uVar11] = pTVar13;
      }
    }
    if ((pTVar17 != (TranslationBlock *)0x0) && (pTVar13->page_addr[1] == 0xffffffffffffffff)) {
      if (1 < (uint)pTStack_80) {
        __assert_fail("n < ARRAY_SIZE(tb->jmp_list_next)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cpu-exec.c"
                      ,0xda,"void tb_add_jump(TranslationBlock *, int, TranslationBlock *)");
      }
      if ((pTVar13->cflags & 0x40000) == 0) {
        LOCK();
        bVar20 = pTVar17->jmp_dest[(long)pTStack_80] == 0;
        if (bVar20) {
          pTVar17->jmp_dest[(long)pTStack_80] = (uintptr_t)pTVar13;
        }
        UNLOCK();
        if (bVar20) {
          pvVar3 = (pTVar17->tc).ptr;
          *(int *)(pTVar17->jmp_target_arg[(long)pTStack_80] + (long)pvVar3) =
               (*(int *)&(pTVar13->tc).ptr -
               ((int)pTVar17->jmp_target_arg[(long)pTStack_80] + (int)pvVar3)) + -4;
          pTVar17->jmp_list_next[(long)pTStack_80] = pTVar13->jmp_list_head;
          pTVar13->jmp_list_head = (ulong)pTVar17 | (ulong)pTStack_80;
        }
      }
    }
    if (cpu->exit_request == false) {
      tVar12 = cpu_tb_exec(cpu,pTVar13);
      cpu->uc->last_tb = pTVar13;
      pTVar13 = (TranslationBlock *)(tVar12 & 0xfffffffffffffffc);
      uVar11 = (uint)tVar12 & 3;
      pTStack_80 = (TranslationBlock *)(ulong)uVar11;
      pTVar17 = pTVar13;
      if (uVar11 == 3) {
        pTVar17 = (TranslationBlock *)0x0;
        pTStack_80 = (TranslationBlock *)0x3;
        if (-1 < *(int *)(cpu[1].tb_jmp_cache + 0x357)) {
          lVar6 = cpu->icount_budget;
          lVar14 = 0xffff;
          if (lVar6 < 0xffff) {
            lVar14 = lVar6;
          }
          uVar11 = (uint)lVar14;
          *(short *)(cpu[1].tb_jmp_cache + 0x357) = (short)lVar14;
          cpu->icount_extra = lVar6 - (int)uVar11;
          pTVar17 = (TranslationBlock *)0x0;
          pTStack_80 = (TranslationBlock *)0x3;
          if (0 < (int)uVar11 && lVar6 - (int)uVar11 == 0) {
            uVar18 = 0x7fff;
            if (uVar11 < 0x7fff) {
              uVar18 = uVar11;
            }
            pTVar17 = tb_gen_code_ppc64(cpu,pTVar13->pc,pTVar13->cs_base,pTVar13->flags,
                                        uVar18 | 0x10000);
            pTVar17->orig_tb = pTVar13;
            cpu_tb_exec(cpu,pTVar17);
            tb_phys_invalidate_ppc64
                      ((TCGContext_conflict10 *)cpu->uc->tcg_ctx,pTVar17,0xffffffffffffffff);
            tcg_tb_remove_ppc64((TCGContext_conflict10 *)cpu->uc->tcg_ctx,pTVar17);
            pTVar17 = (TranslationBlock *)0x0;
            pTStack_80 = (TranslationBlock *)0x3;
          }
        }
      }
    }
  }
  cpu->exit_request = false;
  if (cpu->exception_index == -1) {
    cpu->exception_index = 0x10000;
  }
  goto LAB_009d0c67;
LAB_009d1154:
  puVar2->invalid_error = 0x15;
  cpu->halted = 1;
  goto LAB_009d1176;
  while ((*(char *)((long)pvVar3 + 0x14) != '\0' ||
         (cVar9 = (**(code **)((long)pvVar3 + 0x28))(puVar2,*(undefined8 *)((long)pvVar3 + 0x30)),
         cVar9 == '\0'))) {
LAB_009d10fa:
    plVar15 = plVar15->next;
    if ((plVar15 == (list_item *)0x0) || (pvVar3 = plVar15->data, pvVar3 == (void *)0x0)) {
      puVar2->invalid_error = 10;
      break;
    }
  }
LAB_009d1176:
  uVar11 = 0x10001;
LAB_009d1180:
  uc->cpu->tcg_exit_req = 0;
  (*pCVar19->cpu_exec_exit)((CPUState_conflict *)cpu);
  return uVar11;
}

Assistant:

int cpu_exec(struct uc_struct *uc, CPUState *cpu)
{
    CPUClass *cc = CPU_GET_CLASS(cpu);
    int ret;
    // SyncClocks sc = { 0 };

    if (cpu_handle_halt(cpu)) {
        return EXCP_HALTED;
    }

    // rcu_read_lock();

    cc->cpu_exec_enter(cpu);

    /* Calculate difference between guest clock and host clock.
     * This delay includes the delay of the last cycle, so
     * what we have to do is sleep until it is 0. As for the
     * advance/delay we gain here, we try to fix it next time.
     */
    // init_delay_params(&sc, cpu);

    // Unicorn: We would like to support nested uc_emu_start calls.
    /* prepare setjmp context for exception handling */
    // if (sigsetjmp(cpu->jmp_env, 0) != 0) {
    if (sigsetjmp(uc->jmp_bufs[uc->nested_level - 1], 0) != 0) {
#if defined(__clang__) || !QEMU_GNUC_PREREQ(4, 6)
        /* Some compilers wrongly smash all local variables after
         * siglongjmp. There were bug reports for gcc 4.5.0 and clang.
         * Reload essential local variables here for those compilers.
         * Newer versions of gcc would complain about this code (-Wclobbered). */
        cc = CPU_GET_CLASS(cpu);
#else /* buggy compiler */
        /* Assert that the compiler does not smash local variables. */
        // g_assert(cpu == current_cpu);
        g_assert(cc == CPU_GET_CLASS(cpu));
#endif /* buggy compiler */

        assert_no_pages_locked();
    }

    /* if an exception is pending, we execute it here */
    while (!cpu_handle_exception(cpu, &ret)) {
        TranslationBlock *last_tb = NULL;
        int tb_exit = 0;

        while (!cpu_handle_interrupt(cpu, &last_tb)) {
            uint32_t cflags = cpu->cflags_next_tb;
            TranslationBlock *tb;

            /* When requested, use an exact setting for cflags for the next
               execution.  This is used for icount, precise smc, and stop-
               after-access watchpoints.  Since this request should never
               have CF_INVALID set, -1 is a convenient invalid value that
               does not require tcg headers for cpu_common_reset.  */
            if (cflags == -1) {
                cflags = curr_cflags();
            } else {
                cpu->cflags_next_tb = -1;
            }

            tb = tb_find(cpu, last_tb, tb_exit, cflags);
            if (unlikely(cpu->exit_request)) {
                continue;
            }
            cpu_loop_exec_tb(cpu, tb, &last_tb, &tb_exit);
            /* Try to align the host and virtual clocks
               if the guest is in advance */
            // align_clocks(&sc, cpu);
        }
    }

    // Unicorn: Clear any TCG exit flag that might have been left set by exit requests
    uc->cpu->tcg_exit_req = 0;

    cc->cpu_exec_exit(cpu);
    // rcu_read_unlock();

    return ret;
}